

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool compareDir(string *a,string *b)

{
  anon_class_24_3_39ce2132 local_58;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  bool local_19;
  string *psStack_18;
  bool ok;
  string *b_local;
  string *a_local;
  
  local_19 = true;
  local_58.ok = &local_19;
  local_58.a = a;
  local_58.b = b;
  psStack_18 = b;
  b_local = a;
  std::function<void(std::__cxx11::string_const&)>::
  function<compareDir(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_40,&local_58);
  listFiles(a,&local_40);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_40);
  return (bool)(local_19 & 1);
}

Assistant:

bool compareDir(const std::string& a, const std::string& b)
{
    bool ok = true;
    listFiles(a, [&](const std::string& fileName) {
        auto base = fileName.substr(a.size());
        auto other = b + base;
        if (fileExists(other)) {
            if (!compareFile(fileName, other)) {
                printf("%s and %s differ\n", fileName.c_str(), other.c_str());

                ok = false;
            }

        } else {
            printf("%s does not exist\n", other.c_str());
            ok = false;
        }
    });
    return ok;
}